

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::FixedSizeAllocator::SerializeBuffers
          (FixedSizeAllocator *this,PartialBlockManager *partial_block_manager)

{
  _Hash_node_base *p_Var1;
  pointer this_00;
  
  for (p_Var1 = (this->buffers)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
              ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                            *)(p_Var1 + 2));
    FixedSizeBuffer::Serialize
              (this_00,partial_block_manager,this->available_segments_per_buffer,this->segment_size,
               this->bitmask_offset);
  }
  return;
}

Assistant:

void FixedSizeAllocator::SerializeBuffers(PartialBlockManager &partial_block_manager) {
	for (auto &buffer : buffers) {
		buffer.second->Serialize(partial_block_manager, available_segments_per_buffer, segment_size, bitmask_offset);
	}
}